

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::
     FormatARound<absl::lts_20250127::uint128>
               (bool precision_specified,FormatState *state,uint8_t *leading,uint128 *mantissa,
               int *exp)

{
  bool bVar1;
  unsigned_long *puVar2;
  uint8_t leading_00;
  uint128 val;
  uint128 uVar3;
  size_t local_90;
  lts_20250127 *local_88;
  bool overflow;
  size_t final_nibble_displayed;
  size_t kTotalNibbles;
  int *exp_local;
  uint128 *mantissa_local;
  uint8_t *leading_local;
  FormatState *state_local;
  bool precision_specified_local;
  
  leading_00 = (uint8_t)exp;
  final_nibble_displayed = 0x20;
  kTotalNibbles = (size_t)exp;
  exp_local = (int *)mantissa;
  mantissa_local = (uint128 *)leading;
  leading_local = (uint8_t *)state;
  state_local._7_1_ = precision_specified;
  if (precision_specified) {
    puVar2 = std::max<unsigned_long>(&final_nibble_displayed,&state->precision);
    local_90 = *puVar2 - *(long *)(leading_local + 8);
  }
  else {
    local_90 = 0;
  }
  uVar3.hi_ = local_90;
  uVar3.lo_ = *(uint64_t *)(exp_local + 2);
  bVar1 = HexFloatNeedsRoundUp<absl::lts_20250127::uint128>
                    (*(anon_unknown_0 **)exp_local,uVar3,(ulong)(byte)mantissa_local->lo_,leading_00
                    );
  if (bVar1) {
    bVar1 = IncrementNibble<absl::lts_20250127::uint128>(local_90,(uint128 *)exp_local);
    *(char *)&mantissa_local->lo_ = (char)mantissa_local->lo_ + bVar1;
    if (0xf < (byte)mantissa_local->lo_) {
      *(undefined1 *)&mantissa_local->lo_ = 1;
      uint128::operator=((uint128 *)exp_local,0);
      *(int *)kTotalNibbles = *(int *)kTotalNibbles + 4;
    }
  }
  if ((state_local._7_1_ & 1) != 0) {
    uVar3 = MaskUpToNibbleExclusive<absl::lts_20250127::uint128>(local_90);
    val.hi_ = uVar3.hi_;
    local_88 = (lts_20250127 *)uVar3.lo_;
    val.lo_ = val.hi_;
    uVar3 = operator~(local_88,val);
    uint128::operator&=((uint128 *)exp_local,uVar3);
  }
  return;
}

Assistant:

void FormatARound(bool precision_specified, const FormatState &state,
                  uint8_t *leading, Int *mantissa, int *exp) {
  constexpr size_t kTotalNibbles = sizeof(Int) * 8 / 4;
  // Index of the last nibble that we could display given precision.
  size_t final_nibble_displayed =
      precision_specified
          ? (std::max(kTotalNibbles, state.precision) - state.precision)
          : 0;
  if (HexFloatNeedsRoundUp(*mantissa, final_nibble_displayed, *leading)) {
    // Need to round up.
    bool overflow = IncrementNibble(final_nibble_displayed, mantissa);
    *leading += (overflow ? 1 : 0);
    if (ABSL_PREDICT_FALSE(*leading > 15)) {
      // We have overflowed the leading digit. This would mean that we would
      // need two hex digits to the left of the dot, which is not allowed. So
      // adjust the mantissa and exponent so that the result is always 1.0eXXX.
      *leading = 1;
      *mantissa = 0;
      *exp += 4;
    }
  }
  // Now that we have handled a possible round-up we can go ahead and zero out
  // all the nibbles of the mantissa that we won't need.
  if (precision_specified) {
    *mantissa &= ~MaskUpToNibbleExclusive<Int>(final_nibble_displayed);
  }
}